

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O3

CodeWord ZXing::Pdf417::ReadCodeWord<ZXing::PointT<double>>
                   (BitMatrixCursor<ZXing::PointT<double>_> *cur,int expectedCluster)

{
  byte bVar1;
  BitMatrix *pBVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  PointT<double> PVar7;
  int i;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  array<int,_8UL> np;
  array<int,_8UL> np_1;
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [16];
  undefined1 auStack_b0 [16];
  array<int,_8UL> local_a0;
  _Type local_80;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined8 uStack_58;
  double local_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  double local_38;
  
  pBVar2 = cur->img;
  dVar5 = (cur->p).x;
  dVar6 = (cur->p).y;
  dVar3 = (cur->d).y;
  PVar7 = cur->d;
  uVar14 = 0;
  local_70 = (undefined1  [16])
             BitMatrixCursor<ZXing::PointT<double>>::readPattern<std::array<unsigned_short,8ul>>
                       ((BitMatrixCursor<ZXing::PointT<double>> *)cur,0);
  local_a0._M_elems._0_8_ = local_70;
  local_a0._M_elems[2] = 8;
  local_a0._M_elems[4] = 0;
  local_a0._M_elems[5] = 0;
  local_a0._M_elems[6] = 0;
  local_a0._M_elems[7] = 0;
  NormalizedPattern<8,17>((array<int,_8UL> *)local_c8,(ZXing *)&local_a0,local_70._8_8_);
  uVar13 = (((local_c8._0_4_ + auStack_c0._8_4_) - (auStack_c0._0_4_ + auStack_b0._0_4_)) + 9) % 9;
  if ((expectedCluster == -1) || (uVar13 == expectedCluster)) {
    lVar8 = 0;
    do {
      uVar11 = ~(uint)lVar8 & 1;
      uVar14 = (uVar11 << (local_c8[lVar8 * 4] & 0x1f)) - uVar11 |
               uVar14 << (local_c8[lVar8 * 4] & 0x1f);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    uVar14 = CodewordDecoder::GetCodeword(uVar14);
    uVar10 = (ulong)uVar14;
    if (uVar14 != 0xffffffff) goto LAB_00176b06;
  }
  local_50 = dVar3;
  local_48 = PVar7.x._0_4_;
  uStack_44 = PVar7.x._4_4_ ^ 0x80000000;
  uStack_40 = PVar7.y._0_4_;
  uStack_3c = PVar7.y._4_4_ ^ 0x80000000;
  local_38 = PVar7.x;
  uVar15 = PVar7.y._0_4_;
  uVar14 = PVar7.y._4_4_;
  if (ABS(PVar7.y) <= ABS(PVar7.x)) {
    uVar15 = PVar7.x._0_4_;
    uVar14 = PVar7.x._4_4_;
  }
  auVar16._8_4_ = uVar15;
  auVar16._0_8_ = CONCAT44(uVar14,uVar15) & 0x7fffffffffffffff;
  auVar16._12_4_ = uVar14 & 0x7fffffff;
  auVar16 = divpd((undefined1  [16])PVar7,auVar16);
  lVar8 = 0;
  do {
    local_c8 = (undefined1  [8])pBVar2;
    dVar3 = *(double *)((long)&local_50 + lVar8) + dVar5;
    dVar4 = *(double *)((long)&local_48 + lVar8) + dVar6;
    auStack_c0._8_4_ = SUB84(dVar4,0);
    auStack_c0._0_8_ = dVar3;
    auStack_c0._12_4_ = (int)((ulong)dVar4 >> 0x20);
    auStack_b0 = auVar16;
    if ((((0.0 <= dVar3) && (dVar3 < (double)pBVar2->_width)) && (0.0 <= dVar4)) &&
       (dVar4 < (double)pBVar2->_height)) {
      local_80 = (_Type)BitMatrixCursor<ZXing::PointT<double>>::
                        readPattern<std::array<unsigned_short,8ul>>
                                  ((BitMatrixCursor<ZXing::PointT<double>> *)local_c8,0);
      local_70._8_4_ = 8;
      local_70._0_8_ = local_80;
      local_60 = 0;
      uStack_58 = 0;
      NormalizedPattern<8,17>(&local_a0,(ZXing *)local_70,local_80._8_8_);
      uVar14 = (((local_a0._M_elems[0] + local_a0._M_elems[4]) -
                (local_a0._M_elems[2] + local_a0._M_elems[6])) + 9) % 9;
      if ((expectedCluster == -1) || (uVar14 == expectedCluster)) {
        lVar9 = 0;
        uVar11 = 0;
        do {
          bVar1 = (byte)local_a0._M_elems[lVar9];
          uVar12 = ~(uint)lVar9 & 1;
          uVar11 = (uVar12 << (bVar1 & 0x1f)) - uVar12 | uVar11 << (bVar1 & 0x1f);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        uVar11 = CodewordDecoder::GetCodeword(uVar11);
        uVar10 = (ulong)uVar11;
        if (uVar11 != 0xffffffff) {
          (cur->d).y = (double)auStack_b0._8_8_;
          (cur->p).y = (double)auStack_c0._8_8_;
          (cur->d).x = (double)auStack_b0._0_8_;
          cur->img = (BitMatrix *)local_c8;
          (cur->p).x = (double)auStack_c0._0_8_;
          uVar13 = uVar14;
          goto LAB_00176b06;
        }
      }
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x20);
  uVar10 = 0xffffffff;
LAB_00176b06:
  return (CodeWord)((ulong)uVar13 | uVar10 << 0x20);
}

Assistant:

CodeWord ReadCodeWord(BitMatrixCursor<POINT>& cur, int expectedCluster = -1)
{
	auto readCodeWord = [expectedCluster](auto& cur) -> CodeWord {
		auto np     = NormalizedPattern<8, 17>(cur.template readPattern<Pattern417>());
		int cluster = (np[0] - np[2] + np[4] - np[6] + 9) % 9;
		int code = expectedCluster == -1 || cluster == expectedCluster ? CodewordDecoder::GetCodeword(ToInt(np)) : -1;

		return {cluster, code};
	};

	auto curBackup = cur;
	auto cw = readCodeWord(cur);
	if (!cw) {
		for (auto offset : {curBackup.left(), curBackup.right()}) {
			auto curAlt = curBackup.movedBy(offset);
			if (!curAlt.isIn()) // curBackup might be the first or last image row
				continue;
			if (auto cwAlt = readCodeWord(curAlt)) {
				cur = curAlt;
				return cwAlt;
			}
		}
	}
	return cw;
}